

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

void __thiscall
slang::ast::PatternCaseStatement::serializeTo(PatternCaseStatement *this,ASTSerializer *serializer)

{
  size_type sVar1;
  Pattern *__n;
  Statement *__n_00;
  size_t sVar2;
  char *func;
  pointer pIVar3;
  pointer pIVar4;
  string_view name;
  
  sVar2 = strlen(*(char **)(toString(slang::ast::CaseStatementCondition)::strings +
                           (long)(int)this->condition * 8));
  ASTSerializer::write(serializer,9,"condition",sVar2);
  sVar2 = strlen(*(char **)(toString(slang::ast::CaseStatementCheck)::strings +
                           (long)(int)this->check * 8));
  ASTSerializer::write(serializer,5,"check",sVar2);
  ASTSerializer::write(serializer,4,"expr",(size_t)this->expr);
  name._M_str = "items";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->items).size_;
  if (sVar1 != 0) {
    pIVar3 = (this->items).data_;
    pIVar4 = pIVar3 + sVar1;
    do {
      ASTSerializer::startObject(serializer);
      __n = (pIVar3->pattern).ptr;
      if (__n == (Pattern *)0x0) {
        func = 
        "T slang::not_null<const slang::ast::Pattern *>::get() const [T = const slang::ast::Pattern *]"
        ;
LAB_0027ef50:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,func);
      }
      ASTSerializer::write(serializer,7,"pattern",(size_t)__n);
      if (pIVar3->filter != (Expression *)0x0) {
        ASTSerializer::write(serializer,6,"filter",(size_t)pIVar3->filter);
      }
      __n_00 = (pIVar3->stmt).ptr;
      if (__n_00 == (Statement *)0x0) {
        func = 
        "T slang::not_null<const slang::ast::Statement *>::get() const [T = const slang::ast::Statement *]"
        ;
        goto LAB_0027ef50;
      }
      ASTSerializer::write(serializer,4,"stmt",(size_t)__n_00);
      ASTSerializer::endObject(serializer);
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != pIVar4);
  }
  ASTSerializer::endArray(serializer);
  if (this->defaultCase != (Statement *)0x0) {
    ASTSerializer::write(serializer,0xb,"defaultCase",(size_t)this->defaultCase);
    return;
  }
  return;
}

Assistant:

void PatternCaseStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.write("condition", toString(condition));
    serializer.write("check", toString(check));
    serializer.write("expr", expr);
    serializer.startArray("items");
    for (auto const& item : items) {
        serializer.startObject();
        serializer.write("pattern", *item.pattern);

        if (item.filter)
            serializer.write("filter", *item.filter);

        serializer.write("stmt", *item.stmt);
        serializer.endObject();
    }
    serializer.endArray();

    if (defaultCase) {
        serializer.write("defaultCase", *defaultCase);
    }
}